

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall
duckdb_parquet::FileCryptoMetaData::FileCryptoMetaData
          (FileCryptoMetaData *this,FileCryptoMetaData *other245)

{
  *(undefined ***)this = &PTR__FileCryptoMetaData_0049d8f8;
  EncryptionAlgorithm::EncryptionAlgorithm(&this->encryption_algorithm);
  (this->key_metadata)._M_dataplus._M_p = (pointer)&(this->key_metadata).field_2;
  (this->key_metadata)._M_string_length = 0;
  (this->key_metadata).field_2._M_local_buf[0] = '\0';
  this->__isset = (_FileCryptoMetaData__isset)((byte)this->__isset & 0xfe);
  EncryptionAlgorithm::operator=(&this->encryption_algorithm,&other245->encryption_algorithm);
  std::__cxx11::string::_M_assign((string *)&this->key_metadata);
  this->__isset = other245->__isset;
  return;
}

Assistant:

FileCryptoMetaData::FileCryptoMetaData(const FileCryptoMetaData& other245) {
  encryption_algorithm = other245.encryption_algorithm;
  key_metadata = other245.key_metadata;
  __isset = other245.__isset;
}